

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O1

void __thiscall test_b_tree::test_basic(test_b_tree *this)

{
  runtime_error *prVar1;
  optional<long> oVar2;
  b_tree t;
  string local_90;
  b_tree local_70;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"test.db","");
  b_tree::b_tree(&local_70,&local_90,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  oVar2 = b_tree::search(&local_70,0x2f);
  if ((((undefined1  [16])
        oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
       (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     (oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload != 0x93)) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    rtf_format_abi_cxx11_
              (&local_90,"%s at Line:%d File:%s","t.search(47) == 147",0x55,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
              );
    std::runtime_error::runtime_error(prVar1,(string *)&local_90);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  oVar2 = b_tree::search(&local_70,0);
  if ((((undefined1  [16])
        oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
       (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     (oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload != 100)) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    rtf_format_abi_cxx11_
              (&local_90,"%s at Line:%d File:%s","t.search(0) == 100",0x56,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
              );
    std::runtime_error::runtime_error(prVar1,(string *)&local_90);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  oVar2 = b_tree::search(&local_70,99);
  if ((((undefined1  [16])
        oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
       (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
     (oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload == 199)) {
    pager::~pager(&local_70._p);
    return;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  rtf_format_abi_cxx11_
            (&local_90,"%s at Line:%d File:%s","t.search(99) == 199",0x57,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
            );
  std::runtime_error::runtime_error(prVar1,(string *)&local_90);
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}